

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::init
          (SwapBuffersWithDamageTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  EGLConfig pvVar1;
  NativeDisplay *pNVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLenum err;
  int extraout_EAX;
  Library *pLVar6;
  EGLDisplay pvVar7;
  undefined4 extraout_var;
  NativeWindowFactory *pNVar8;
  undefined4 extraout_var_00;
  EGLSurface pvVar9;
  undefined4 extraout_var_01;
  GLES2Renderer *pGVar10;
  TestError *this_00;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  string local_120;
  ProgramSources local_100;
  
  pLVar6 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar7;
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,pLVar6,pvVar7);
  this->m_eglConfig = (EGLConfig)CONCAT44(extraout_var,iVar3);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,pLVar6,this->m_eglDisplay);
  pvVar1 = this->m_eglConfig;
  pNVar8 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar7 = this->m_eglDisplay;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       eglu::parseWindowVisibility
                 (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1e0000001e0;
  iVar3 = (*(pNVar8->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar8,pNVar2,pvVar7,pvVar1,0,&local_100);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var_00,iVar3);
  pvVar9 = eglu::createWindowSurface
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_00,iVar3),this->m_eglDisplay
                      ,pvVar1,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar9;
  pvVar1 = this->m_eglConfig;
  pLVar6 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200003098;
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3038;
  (**pLVar6->_vptr_Library)(pLVar6,0x30a0);
  iVar3 = (*pLVar6->_vptr_Library[6])(pLVar6,this->m_eglDisplay,pvVar1,0,&local_100);
  this->m_eglContext = (EGLContext)CONCAT44(extraout_var_01,iVar3);
  dVar4 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x184);
  pvVar9 = this->m_eglSurface;
  if (pvVar9 != (EGLSurface)0x0) {
    (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_eglDisplay,pvVar9,pvVar9,this->m_eglContext);
    dVar4 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
    eglu::checkError(dVar4,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x187);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pGVar10 = (GLES2Renderer *)operator_new(0xe0);
    pGVar10->m_gl = dst;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,
               "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
               ,&local_141);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,
               "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",
               &local_142);
    glu::makeVtxFragSources(&local_100,&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    glu::ShaderProgram::ShaderProgram(&pGVar10->m_glProgram,dst,&local_100);
    glu::ProgramSources::~ProgramSources(&local_100);
    pGVar10->m_coordLoc = 0xffffffff;
    pGVar10->m_colorLoc = 0xffffffff;
    GVar5 = (*pGVar10->m_gl->getAttribLocation)
                      ((pGVar10->m_glProgram).m_program.m_program,"a_color");
    pGVar10->m_colorLoc = GVar5;
    GVar5 = (*pGVar10->m_gl->getAttribLocation)((pGVar10->m_glProgram).m_program.m_program,"a_pos");
    pGVar10->m_coordLoc = GVar5;
    err = (*pGVar10->m_gl->getError)();
    glu::checkError(err,"Failed to get attribute locations",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                    ,0xb5);
    this->m_gles2Renderer = pGVar10;
    return extraout_EAX;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
             ,0x185);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SwapBuffersWithDamageTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig  = getConfig(egl, m_eglDisplay);

	checkExtension(egl, m_eglDisplay);

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
	m_gles2Renderer = new GLES2Renderer(m_gl);
}